

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preBegin__profile_GLSL__technique__pass__shader__bind__param
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  profile_GLSL__technique__pass__shader__bind__param__AttributeData *elementHash;
  StringHash SVar2;
  undefined8 *puVar3;
  undefined8 in_RCX;
  ParserTemplateBase *in_RDX;
  long *in_RSI;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  profile_GLSL__technique__pass__shader__bind__param__AttributeData *attributeData;
  ParserChar *in_stack_00000098;
  ParserChar *in_stack_000000a0;
  StringHash in_stack_000000a8;
  ErrorType in_stack_000000b0;
  Severity in_stack_000000b4;
  ParserTemplateBase *in_stack_000000b8;
  void **in_stack_ffffffffffffffb8;
  ParserTemplateBase *in_stack_ffffffffffffffc0;
  undefined8 *attributeHash;
  bool local_1;
  
  elementHash = GeneratedSaxParser::ParserTemplateBase::
                newData<COLLADASaxFWL14::profile_GLSL__technique__pass__shader__bind__param__AttributeData>
                          (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  attributeHash = (undefined8 *)*in_RSI;
  if (attributeHash == (undefined8 *)0x0) {
LAB_0089f4b2:
    if ((elementHash->ref == (ParserChar *)0x0) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (in_RDX,(Severity)((ulong)in_RCX >> 0x20),(ErrorType)in_RCX,
                           (StringHash)elementHash,(StringHash)attributeHash,
                           (ParserChar *)in_stack_ffffffffffffffc0), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        if ((ParserChar *)*attributeHash == (ParserChar *)0x0) {
          in_stack_ffffffffffffffc0 = (ParserTemplateBase *)0x0;
          goto LAB_0089f4b2;
        }
        SVar2 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)*attributeHash);
        puVar3 = attributeHash + 1;
        if (puVar3 == (undefined8 *)0x0) {
          return false;
        }
        attributeHash = attributeHash + 2;
        if (SVar2 != 0x78b6) break;
        elementHash->ref = (ParserChar *)*puVar3;
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a8,
                         in_stack_000000a0,in_stack_00000098);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass__shader__bind__param( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLSL__technique__pass__shader__bind__param( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLSL__technique__pass__shader__bind__param__AttributeData* attributeData = newData<profile_GLSL__technique__pass__shader__bind__param__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ref:
    {

attributeData->ref = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_PARAM, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( !attributeData->ref )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_PARAM, HASH_ATTRIBUTE_ref, 0 ) )
        return false;
}


    return true;
}